

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O2

int hintcmp(void *ai,void *aj)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = **aj;
  uVar2 = **ai;
  if (uVar2 <= uVar1) {
    if (uVar2 < uVar1) {
      return -1;
    }
    uVar1 = **(uint **)(*ai + 4);
    uVar2 = **(uint **)(*aj + 4);
    if (uVar1 <= uVar2) {
      return -(uint)(uVar1 < uVar2);
    }
  }
  return 1;
}

Assistant:

static int hintcmp(const void *ai, const void *aj) {
  Hint *i = *(Hint **)ai;
  Hint *j = *(Hint **)aj;
  return (i->depth > j->depth)
             ? 1
             : ((i->depth < j->depth)
                    ? -1
                    : ((i->rule->index > j->rule->index) ? 1 : ((i->rule->index < j->rule->index) ? -1 : 0)));
}